

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  byte bVar1;
  Table *pTVar2;
  AggInfo *pAVar3;
  VList *pVVar4;
  sqlite3 *psVar5;
  char cVar6;
  u8 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Parse *pPVar12;
  Select *pSVar13;
  FuncDef *zP4;
  CollSeq *zP4_00;
  u8 uVar14;
  Op *pOVar15;
  u8 uVar16;
  uint uVar17;
  size_t __n;
  SrcList **ppSVar18;
  Vdbe *pVVar19;
  char *pcVar20;
  ExprList_item *pEVar21;
  int iVar22;
  int *piVar23;
  char *zFormat;
  Expr *pEVar24;
  size_t sVar25;
  long lVar26;
  byte bVar27;
  Vdbe *v;
  Expr *pEVar28;
  uint opcode;
  ulong uVar29;
  ExprList *local_128;
  int local_11c;
  int local_118;
  int regFree1;
  Vdbe *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  sqlite3 *local_e8;
  FuncDef *local_e0;
  int regFree2;
  int regFree2_1;
  int regFree1_1;
  Expr tempX;
  Expr opCompare;
  
code_r0x0016a8cf:
  pVVar19 = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (pVVar19 == (Vdbe *)0x0) {
    return 0;
  }
joined_r0x0016a900:
  iVar9 = target;
  if (pExpr == (Expr *)0x0) {
switchD_0016a929_caseD_72:
    iVar10 = 0x49;
    uVar8 = 0;
LAB_0016a942:
    iVar22 = 0;
LAB_0016a945:
    sqlite3VdbeAddOp3(pVVar19,iVar10,uVar8,iVar9,iVar22);
    return target;
  }
  bVar27 = pExpr->op;
  uVar8 = (uint)bVar27;
  uVar11 = (uint)bVar27;
  if (bVar27 < 0x60) {
    switch(bVar27) {
    case 0x13:
      goto switchD_0016a929_caseD_6b;
    case 0x14:
      goto switchD_0016a965_caseD_14;
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2e:
    case 0x2f:
      goto switchD_0016a929_caseD_6c;
    case 0x24:
      iVar9 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
      if (iVar9 != target) {
        sqlite3VdbeAddOp3(pVVar19,0x4f,iVar9,target,0);
      }
      cVar6 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar10 = 0x55;
      iVar9 = (int)cVar6;
      uVar8 = target;
      goto LAB_0016a942;
    case 0x2b:
    case 0x2c:
switchD_0016a929_caseD_60:
      iVar22 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      iVar10 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
      uVar11 = (uint)bVar27;
      goto LAB_0016a9a6;
    case 0x2d:
      goto switchD_0016a929_caseD_a0;
    case 0x30:
      exprCodeBetween(pParse,pExpr,target,(_func_void_Parse_ptr_Expr_ptr_int_int *)0x0,0);
      return target;
    case 0x31:
      iVar9 = pParse->nLabel + -1;
      iVar10 = pParse->nLabel + -2;
      pParse->nLabel = iVar10;
      sqlite3VdbeAddOp3(pVVar19,0x49,0,target,0);
      sqlite3ExprCodeIN(pParse,pExpr,iVar9,iVar10);
      sqlite3VdbeAddOp3(pVVar19,0x46,1,target,0);
      sqlite3VdbeResolveLabel(pVVar19,iVar9);
      sqlite3VdbeAddOp3(pVVar19,0x53,target,0,0);
      sqlite3VdbeResolveLabel(pVVar19,iVar10);
      return target;
    case 0x32:
    case 0x33:
      sqlite3VdbeAddOp3(pVVar19,0x46,1,target,0);
      iVar9 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      iVar9 = sqlite3VdbeAddOp3(pVVar19,uVar11,iVar9,0,0);
      sqlite3VdbeAddOp3(pVVar19,0x46,0,target,0);
      if (pVVar19->db->mallocFailed == '\0') {
        iVar10 = pVVar19->nOp + -1;
        if (-1 < iVar9) {
          iVar10 = iVar9;
        }
        pOVar15 = pVVar19->aOp + iVar10;
      }
      else {
        pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar15->p2 = pVVar19->nOp;
      break;
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      uVar11 = 0;
      goto LAB_0016aad4;
    default:
      if (bVar27 == 0x47) {
        if (pParse->pTriggerTab == (Table *)0x0) {
          sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
          return 0;
        }
        cVar6 = pExpr->affinity;
        if (cVar6 == '\x04') {
          pcVar20 = (pExpr->u).zToken;
          iVar9 = sqlite3VdbeAddOp3(pVVar19,0x45,0,4,0);
          sqlite3VdbeChangeP4(pVVar19,iVar9,pcVar20,0);
        }
        else {
          if (cVar6 == '\x02') {
            pPVar12 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar12 = pParse;
            }
            pPVar12->mayAbort = '\x01';
          }
          sqlite3HaltConstraint(pParse,0x713,(int)cVar6,(pExpr->u).zToken,'\0','\0');
        }
      }
      else {
        if (uVar11 != 0x4d) goto switchD_0016a929_caseD_6c;
        pTVar2 = (pExpr->y).pTab;
        sqlite3VdbeAddOp3(pVVar19,0x95,(int)pExpr->iColumn + (pTVar2->nCol + 1) * pExpr->iTable + 1,
                          target,0);
        if ((-1 < (long)pExpr->iColumn) && (pTVar2->aCol[pExpr->iColumn].affinity == 'E')) {
          uVar11 = 0x54;
          iVar10 = target;
          iVar22 = 0;
          goto LAB_0016aab4;
        }
      }
    }
    goto LAB_0016b7ac;
  }
  switch(bVar27) {
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
    goto switchD_0016a929_caseD_60;
  case 0x6a:
  case 0xa6:
  case 0xad:
    goto switchD_0016a929_caseD_6a;
  case 0x6b:
switchD_0016a929_caseD_6b:
    iVar10 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar22 = target;
LAB_0016aab4:
    iVar9 = 0;
    break;
  default:
switchD_0016a929_caseD_6c:
    local_f8 = (pExpr->x).pSelect;
    local_e8 = (sqlite3 *)(long)*(int *)&local_f8->pEList;
    iVar9 = pParse->nLabel + -1;
    pParse->nLabel = iVar9;
    local_f0 = pExpr->pLeft;
    if (local_f0 == (Expr *)0x0) {
      pEVar24 = (Expr *)0x0;
      local_100 = pVVar19;
    }
    else {
      tempX.iColumn = 0;
      tempX.iAgg = 0;
      tempX.iRightJoinTable = 0;
      tempX.op2 = '\0';
      tempX._55_1_ = 0;
      tempX.pAggInfo = (AggInfo *)0x0;
      tempX.x.pList = (ExprList *)0x0;
      tempX.nHeight = 0;
      tempX.iTable = 0;
      tempX.pLeft = (Expr *)0x0;
      tempX.pRight = (Expr *)0x0;
      tempX.op = '\0';
      tempX.affinity = '\0';
      tempX._2_2_ = 0;
      tempX.flags._0_1_ = 0;
      tempX.flags._1_1_ = 0;
      tempX.flags._2_2_ = 0;
      tempX.u.iValue = 0;
      tempX.u._4_4_ = 0;
      tempX.y.pTab = (Table *)0x0;
      sVar25 = 0x2c;
      if ((local_f0->flags >> 0xd & 1) == 0) {
        sVar25 = 0x48;
      }
      __n = 0x10;
      if ((local_f0->flags >> 0xe & 1) == 0) {
        __n = sVar25;
      }
      local_100 = pVVar19;
      memcpy(&tempX,local_f0,__n);
      iVar10 = exprCodeVector(pParse,&tempX,&regFree1);
      tempX.op2 = tempX.op;
      tempX.op = 0xa8;
      tempX.iTable = iVar10;
      tempX.flags._1_1_ = tempX.flags._1_1_ & 0xef;
      pEVar24 = &opCompare;
      opCompare.u.zToken = (char *)0x0;
      opCompare.pRight = (Expr *)0x0;
      opCompare.x.pList = (ExprList *)0x0;
      opCompare.nHeight = 0;
      opCompare.iTable = 0;
      opCompare.iColumn = 0;
      opCompare.iAgg = 0;
      opCompare.iRightJoinTable = 0;
      opCompare.op2 = '\0';
      opCompare._55_1_ = 0;
      opCompare.pAggInfo = (AggInfo *)0x0;
      opCompare.y.pTab = (Table *)0x0;
      opCompare.op = '5';
      opCompare.affinity = '\0';
      opCompare._2_2_ = 0;
      opCompare.flags = 0;
      opCompare.pLeft = &tempX;
    }
    psVar5 = local_e8;
    pVVar19 = local_100;
    regFree1 = 0;
    local_118 = (int)local_e8 + -1;
    if (1 < (int)local_e8) {
      ppSVar18 = &local_f8->pSrc;
      iVar10 = 0;
      do {
        pEVar28 = (Expr *)ppSVar18[-4];
        if (local_f0 != (Expr *)0x0) {
          pEVar28 = pEVar24;
          opCompare.pRight = (Expr *)ppSVar18[-4];
        }
        iVar22 = pParse->nLabel + -1;
        pParse->nLabel = iVar22;
        sqlite3ExprIfFalse(pParse,pEVar28,iVar22,0x10);
        sqlite3ExprCode(pParse,(Expr *)*ppSVar18,target);
        sqlite3VdbeAddOp3(pVVar19,0xb,0,iVar9,0);
        sqlite3VdbeResolveLabel(pVVar19,iVar22);
        ppSVar18 = ppSVar18 + 8;
        iVar10 = iVar10 + 2;
        pEVar24 = pEVar28;
      } while (iVar10 < local_118);
    }
    pVVar19 = local_100;
    if (((ulong)local_e8 & 1) == 0) {
      sqlite3VdbeAddOp3(local_100,0x49,0,target,0);
    }
    else {
      sqlite3ExprCode(pParse,*(Expr **)(local_f8->addrOpenEphm + (long)psVar5 * 8 + -0xd),target);
      pVVar19 = local_100;
    }
    sqlite3VdbeResolveLabel(pVVar19,iVar9);
    goto LAB_0016b7ac;
  case 0x6e:
    sqlite3VdbeLoadString(pVVar19,target,(pExpr->u).zToken);
    return target;
  case 0x72:
    goto switchD_0016a929_caseD_72;
  case 0x83:
    uVar8 = ((pExpr->x).pSelect)->pEList->nExpr;
    if (uVar8 == 1) {
switchD_0016a965_caseD_14:
      iVar9 = sqlite3CodeSubselect(pParse,pExpr);
      return iVar9;
    }
    sqlite3ErrorMsg(pParse,"sub-select returns %d columns - expected %d",(ulong)uVar8,1);
    goto LAB_0016b7ac;
  case 0x91:
    pcVar20 = (pExpr->u).zToken;
    iVar9 = 0;
LAB_0016b5fa:
    codeReal(pVVar19,pcVar20,iVar9,target);
    return target;
  case 0x92:
    pcVar20 = (pExpr->u).zToken;
    sVar25 = strlen(pcVar20 + 2);
    uVar8 = (uint)sVar25 & 0x3fffffff;
    iVar9 = uVar8 - 1;
    pcVar20 = (char *)sqlite3HexToBlob(pVVar19->db,pcVar20 + 2,iVar9);
    iVar9 = sqlite3VdbeAddOp3(pVVar19,0x4b,(int)((uVar8 - (iVar9 >> 0x1f)) + -1) >> 1,target,0);
    iVar10 = -7;
    goto LAB_0016b6a4;
  case 0x93:
    iVar9 = 0;
LAB_0016af5a:
    codeInteger(pParse,pExpr,iVar9,target);
    return target;
  case 0x94:
    sqlite3VdbeAddOp3(pVVar19,0x4c,(int)pExpr->iColumn,target,0);
    if ((pExpr->u).zToken[1] == '\0') {
      return target;
    }
    pVVar4 = pParse->pVList;
    if (pVVar4 == (VList *)0x0) goto LAB_0016aef6;
    iVar9 = 2;
    goto LAB_0016aee0;
  case 0x9f:
    uVar8 = (uint)((pExpr->u).zToken[4] == '\0');
    iVar10 = 0x46;
    goto LAB_0016a942;
  case 0xa0:
switchD_0016a929_caseD_a0:
    uVar8 = uVar11 == 0x2d | 0x34;
    uVar11 = 0x80;
LAB_0016aad4:
    pEVar24 = pExpr->pLeft;
    uVar7 = pEVar24->op;
    uVar14 = uVar7;
    if (uVar7 == 0xa8) {
      uVar14 = pEVar24->op2;
    }
    if (uVar14 == 0x83) {
      pSVar13 = (pEVar24->x).pSelect;
LAB_0016ab0e:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar13->pEList)->pList->nExpr) {
        uVar14 = uVar7;
        if (uVar7 == 0xa8) {
          uVar14 = pEVar24->op2;
        }
        pEVar28 = pExpr->pRight;
        if (uVar14 == 0x83) {
          pSVar13 = (pEVar24->x).pSelect;
LAB_0016b1b0:
          local_f0 = (Expr *)(ulong)(uint)((anon_union_8_2_a01b6dbf_for_x *)&pSVar13->pEList)->pList
                                          ->nExpr;
        }
        else {
          local_f0 = (Expr *)0x1;
          if (uVar14 == 0xa9) {
            pSVar13 = (Select *)&pEVar24->x;
            goto LAB_0016b1b0;
          }
        }
        iVar9 = pParse->nLabel + -1;
        local_e8 = (sqlite3 *)CONCAT44(local_e8._4_4_,iVar9);
        pParse->nLabel = iVar9;
        uVar14 = pEVar28->op;
        uVar16 = uVar14;
        if (uVar14 == 0xa8) {
          uVar16 = pEVar28->op2;
        }
        if (uVar16 == 0x83) {
          pSVar13 = (pEVar28->x).pSelect;
LAB_0016b207:
          iVar9 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar13->pEList)->pList->nExpr;
        }
        else {
          iVar9 = 1;
          if (uVar16 == 0xa9) {
            pSVar13 = (Select *)&pEVar28->x;
            goto LAB_0016b207;
          }
        }
        local_100 = pVVar19;
        if ((int)local_f0 == iVar9) {
          uVar17 = 0x38;
          if (uVar8 != 0x37) {
            uVar17 = uVar8;
          }
          opcode = 0x36;
          if ((char)uVar17 != '9') {
            opcode = uVar17;
          }
          local_f8 = (Select *)((ulong)local_f8 & 0xffffffff00000000);
          local_e0 = (FuncDef *)((ulong)local_e0 & 0xffffffff00000000);
          if (uVar7 == 0x83) {
            iVar9 = sqlite3CodeSubselect(pParse,pEVar24);
            local_e0 = (FuncDef *)CONCAT44(local_e0._4_4_,iVar9);
            uVar14 = pEVar28->op;
          }
          if (uVar14 == 0x83) {
            iVar9 = sqlite3CodeSubselect(pParse,pEVar28);
            local_f8 = (Select *)CONCAT44(local_f8._4_4_,iVar9);
          }
          bVar27 = (byte)uVar11 | 0x20;
          local_f0 = (Expr *)(ulong)(uint)-(int)local_f0;
          iVar9 = 0;
          while( true ) {
            regFree1_1 = 0;
            regFree2_1 = 0;
            iVar10 = exprVectorRegister(pParse,pEVar24,iVar9,(int)local_e0,(Expr **)&tempX,
                                        &regFree1_1);
            iVar22 = exprVectorRegister(pParse,pEVar28,iVar9,(uint)local_f8,(Expr **)&opCompare,
                                        &regFree2_1);
            codeCompare(pParse,(Expr *)CONCAT26(tempX.flags._2_2_,
                                                CONCAT15(tempX.flags._1_1_,
                                                         CONCAT14((undefined1)tempX.flags,
                                                                  tempX._0_4_))),
                        (Expr *)opCompare._0_8_,opcode,iVar10,iVar22,target,(uint)bVar27);
            if (regFree1_1 != 0) {
              bVar1 = pParse->nTempReg;
              if ((ulong)bVar1 < 8) {
                pParse->nTempReg = bVar1 + 1;
                pParse->aTempReg[bVar1] = regFree1_1;
              }
            }
            if (regFree2_1 != 0) {
              bVar1 = pParse->nTempReg;
              if ((ulong)bVar1 < 8) {
                pParse->nTempReg = bVar1 + 1;
                pParse->aTempReg[bVar1] = regFree2_1;
              }
            }
            iVar10 = (int)local_f0 + iVar9;
            if (iVar10 == -1) break;
            if ((char)opcode == '4') {
              sqlite3VdbeAddOp3(local_100,0x12,target,(int)local_e8,0);
              bVar27 = bVar27 | 8;
              opcode = 0x34;
            }
            else if (opcode == 0x35) {
              sqlite3VdbeAddOp3(local_100,0x14,target,(int)local_e8,0);
              bVar27 = bVar27 | 8;
              opcode = 0x35;
            }
            else {
              sqlite3VdbeAddOp3(local_100,0x3a,0,(int)local_e8,0);
              if (iVar10 == -2) {
                opcode = uVar8;
              }
            }
            iVar9 = iVar9 + 1;
          }
          sqlite3VdbeResolveLabel(local_100,(int)local_e8);
          goto LAB_0016b7ac;
        }
        goto switchD_0016a929_caseD_a9;
      }
    }
    else if (uVar14 == 0xa9) {
      pSVar13 = (Select *)&pEVar24->x;
      goto LAB_0016ab0e;
    }
    local_100 = pVVar19;
    iVar9 = sqlite3ExprCodeTemp(pParse,pEVar24,&regFree1);
    iVar10 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pEVar24,pExpr->pRight,uVar8,iVar9,iVar10,target,uVar11 | 0x20);
    goto LAB_0016b7ac;
  case 0xa1:
    goto switchD_0016a929_caseD_a1;
  case 0xa2:
    goto switchD_0016a929_caseD_a2;
  case 0xa3:
    if (pExpr->pAggInfo != (AggInfo *)0x0) {
      return pExpr->pAggInfo->aFunc[pExpr->iAgg].iMem;
    }
    pcVar20 = (pExpr->u).zToken;
    zFormat = "misuse of aggregate: %s()";
    goto LAB_0016b7a5;
  case 0xa4:
    pAVar3 = pExpr->pAggInfo;
    if (pAVar3->directMode == '\0') {
      return pAVar3->aCol[pExpr->iAgg].iMem;
    }
    if (pAVar3->useSortingIdx != '\0') {
      uVar8 = pAVar3->sortingIdxPTab;
      iVar9 = pAVar3->aCol[pExpr->iAgg].iSorterColumn;
      iVar10 = 0x5a;
      iVar22 = target;
      goto LAB_0016a945;
    }
switchD_0016a929_caseD_a2:
    if ((pExpr->flags & 8) == 0) {
      iVar9 = pExpr->iTable;
      if (iVar9 < 0) {
        iVar9 = pParse->iSelfTab;
        if (iVar9 < 0) {
          return pExpr->iColumn - iVar9;
        }
        iVar9 = iVar9 + -1;
      }
      bVar27 = pExpr->op2;
      sqlite3ExprCodeGetColumnOfTable(pVVar19,(pExpr->y).pTab,iVar9,(int)pExpr->iColumn,target);
      if (bVar27 == 0) {
        return target;
      }
      if ((long)pVVar19->nOp < 1) {
        return target;
      }
      pVVar19->aOp[(long)pVVar19->nOp + -1].p5 = (ushort)bVar27;
      return target;
    }
    iVar9 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    if ((long)pExpr->iColumn < 0) {
      iVar10 = 0x44;
    }
    else {
      iVar10 = (int)((pExpr->y).pTab)->aCol[pExpr->iColumn].affinity;
      if (iVar10 == 0x41) {
        return iVar9;
      }
    }
    if (iVar9 != target) {
      sqlite3VdbeAddOp3(pVVar19,0x4f,iVar9,target,0);
    }
    pcVar20 = (char *)((long)yyRuleInfoLhs + (long)(iVar10 * 2) + 0x29c);
    iVar9 = sqlite3VdbeAddOp3(pVVar19,0x5b,target,1,0);
    iVar10 = -1;
LAB_0016b6a4:
    sqlite3VdbeChangeP4(pVVar19,iVar9,pcVar20,iVar10);
    return target;
  case 0xa5:
    pEVar24 = pExpr->pLeft;
    if (pEVar24->op == 0x91) {
      pcVar20 = (pEVar24->u).zToken;
      iVar9 = 1;
      goto LAB_0016b5fa;
    }
    if (pEVar24->op == 0x93) {
      iVar9 = 1;
      pExpr = pEVar24;
      goto LAB_0016af5a;
    }
    tempX.op = 0x93;
    tempX.flags._0_1_ = 0;
    tempX.flags._1_1_ = 0x44;
    tempX.flags._2_2_ = 0;
    tempX.u.iValue = 0;
    iVar22 = sqlite3ExprCodeTemp(pParse,&tempX,&regFree1);
    iVar10 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree2);
    uVar11 = 0x65;
    break;
  case 0xa7:
    iVar9 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    cVar6 = (pExpr->pRight->u).zToken[4];
    uVar7 = pExpr->op2;
    iVar9 = sqlite3VdbeAddOp3(pVVar19,0x58,iVar9,target,(uint)(cVar6 != '\0'));
    if (pVVar19->db->mallocFailed == '\0') {
      pOVar15 = pVVar19->aOp;
      pOVar15[iVar9].p4type = -3;
      *(uint *)&pOVar15[iVar9].p4 = (uint)((uVar7 == '-') != (cVar6 == '\0'));
    }
    goto LAB_0016b7ac;
  case 0xa8:
    return pExpr->iTable;
  case 0xa9:
switchD_0016a929_caseD_a9:
    sqlite3ErrorMsg(pParse,"row value misused");
    goto LAB_0016b7ac;
  case 0xaa:
    pEVar24 = pExpr->pLeft;
    if (pEVar24->iTable == 0) {
      iVar9 = sqlite3CodeSubselect(pParse,pEVar24);
      pEVar24 = pExpr->pLeft;
      pEVar24->iTable = iVar9;
    }
    if (pExpr->iTable == 0) goto LAB_0016b6d1;
    uVar7 = pEVar24->op;
    if (uVar7 == 0xa8) {
      uVar7 = pEVar24->op2;
    }
    if (uVar7 == 0x83) {
      pSVar13 = (pEVar24->x).pSelect;
LAB_0016b6b2:
      iVar9 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar13->pEList)->pList->nExpr;
    }
    else {
      iVar9 = 1;
      if (uVar7 == 0xa9) {
        pSVar13 = (Select *)&pEVar24->x;
        goto LAB_0016b6b2;
      }
    }
    if (pExpr->iTable != iVar9) {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values");
      pEVar24 = pExpr->pLeft;
    }
LAB_0016b6d1:
    return (int)pExpr->iColumn + pEVar24->iTable;
  case 0xab:
    iVar10 = sqlite3VdbeAddOp3(pVVar19,0x15,pExpr->iTable,0,0);
    target = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    iVar9 = pVVar19->nOp;
    if (pVVar19->db->mallocFailed == '\0') {
      iVar22 = iVar9 + -1;
      if (-1 < iVar10) {
        iVar22 = iVar10;
      }
      pOVar15 = pVVar19->aOp + iVar22;
      pOVar15->p2 = iVar9;
    }
    else {
      pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
      DAT_00210a80 = iVar9;
    }
    pOVar15->p3 = target;
    goto LAB_0016b7ac;
  }
LAB_0016a9a6:
  sqlite3VdbeAddOp3(pVVar19,uVar11,iVar10,iVar22,iVar9);
  goto LAB_0016b7ac;
switchD_0016a929_caseD_6a:
  pExpr = pExpr->pLeft;
  goto joined_r0x0016a900;
  while (iVar9 = iVar9 + piVar23[1], iVar9 < pVVar4[1]) {
LAB_0016aee0:
    piVar23 = pVVar4 + iVar9;
    if (*piVar23 == (int)pExpr->iColumn) {
      piVar23 = piVar23 + 2;
      goto LAB_0016b6e3;
    }
  }
LAB_0016aef6:
  piVar23 = (int *)0x0;
LAB_0016b6e3:
  *pVVar4 = 0;
  sqlite3VdbeAppendP4(pVVar19,piVar23,-1);
  return target;
switchD_0016a929_caseD_a1:
  uVar8 = pExpr->flags;
  if ((uVar8 >> 0x18 & 1) != 0) {
    return ((pExpr->y).pWin)->regResult;
  }
  psVar5 = pParse->db;
  uVar7 = psVar5->enc;
  if (pParse->okConstFactor != '\0') {
    tempX.x._4_1_ = 2;
    tempX.u.iValue = 0x16e0cb;
    tempX.u._4_4_ = 0;
    tempX.pLeft = (Expr *)sqlite3SelectWalkFail;
    tempX._40_8_ = tempX._40_8_ & 0xffffffff00000000;
    walkExpr((Walker *)&tempX,pExpr);
    if (tempX.x._4_1_ != '\0') {
      iVar9 = sqlite3ExprCodeAtInit(pParse,pExpr,-1);
      return iVar9;
    }
    uVar8 = pExpr->flags;
  }
  local_128 = (ExprList *)(ulong)uVar8;
  if (((uVar8 >> 0xe & 1) == 0) && (local_128 = (pExpr->x).pList, local_128 != (ExprList *)0x0)) {
    uVar8 = local_128->nExpr;
    local_f0 = (Expr *)((ulong)local_f0._4_4_ << 0x20);
  }
  else {
    local_f0 = (Expr *)CONCAT44(local_f0._4_4_,(int)CONCAT71((int7)((ulong)local_128 >> 8),1));
    local_128 = (ExprList *)0x0;
    uVar8 = 0;
  }
  pcVar20 = (pExpr->u).zToken;
  local_100 = pVVar19;
  local_e8 = psVar5;
  zP4 = sqlite3FindFunction(psVar5,pcVar20,uVar8,uVar7,'\0');
  if ((zP4 == (FuncDef *)0x0) || (zP4->xFinalize != (_func_void_sqlite3_context_ptr *)0x0)) {
    zFormat = "unknown function: %s()";
LAB_0016b7a5:
    sqlite3ErrorMsg(pParse,zFormat,pcVar20);
    goto LAB_0016b7ac;
  }
  uVar11 = zP4->funcFlags;
  if ((uVar11 >> 9 & 1) != 0) {
    iVar9 = pParse->nLabel + -1;
    pParse->nLabel = iVar9;
    sqlite3ExprCode(pParse,local_128->a[0].pExpr,target);
    pVVar19 = local_100;
    if (1 < (int)uVar8) {
      lVar26 = 0;
      do {
        sqlite3VdbeAddOp3(pVVar19,0x33,target,iVar9,0);
        sqlite3ExprCode(pParse,*(Expr **)((long)local_128[1].a + lVar26 + -8),target);
        lVar26 = lVar26 + 0x20;
      } while ((ulong)uVar8 * 0x20 + -0x20 != lVar26);
    }
    sqlite3VdbeResolveLabel(pVVar19,iVar9);
LAB_0016b7ac:
    if (regFree1 != 0) {
      bVar27 = pParse->nTempReg;
      if ((ulong)bVar27 < 8) {
        pParse->nTempReg = bVar27 + 1;
        pParse->aTempReg[bVar27] = regFree1;
      }
    }
    if (regFree2 == 0) {
      return target;
    }
    bVar27 = pParse->nTempReg;
    if (7 < (ulong)bVar27) {
      return target;
    }
    pParse->nTempReg = bVar27 + 1;
    pParse->aTempReg[bVar27] = regFree2;
    return target;
  }
  if ((uVar11 >> 10 & 1) != 0) {
    pExpr = local_128->a[0].pExpr;
    goto code_r0x0016a8cf;
  }
  local_e0 = zP4;
  if ((int)uVar8 < 1) {
    iVar9 = 0;
    if ((char)local_f0 != '\0') {
      local_f8 = (Select *)((ulong)local_f8._4_4_ << 0x20);
      local_11c = 0;
      pVVar19 = local_100;
      if ((uVar11 & 0x20) == 0) goto LAB_0016bac8;
      goto LAB_0016ba8d;
    }
    zP4_00 = (CollSeq *)0x0;
    goto LAB_0016b9ba;
  }
  pEVar21 = local_128->a;
  uVar29 = 0;
  local_f8 = (Select *)((ulong)local_f8._4_4_ << 0x20);
  zP4_00 = (CollSeq *)0x0;
  do {
    if ((uVar29 < 0x20) &&
       (iVar9 = sqlite3ExprIsConstant(pEVar21->pExpr), zP4 = local_e0, iVar9 != 0)) {
      local_f8 = (Select *)CONCAT44(local_f8._4_4_,(uint)local_f8 | 1 << ((uint)uVar29 & 0x1f));
    }
    if (((zP4->funcFlags & 0x20) != 0) && (zP4_00 == (CollSeq *)0x0)) {
      zP4_00 = sqlite3ExprCollSeq(pParse,pEVar21->pExpr);
    }
    uVar29 = uVar29 + 1;
    pEVar21 = pEVar21 + 1;
  } while (uVar8 != uVar29);
  local_11c = 0;
  if ((char)local_f0 == '\0') {
    if ((uint)local_f8 == 0) {
LAB_0016b9ba:
      local_11c = sqlite3GetTempRange(pParse,uVar8);
      local_f8 = (Select *)((ulong)local_f8 & 0xffffffff00000000);
    }
    else {
      local_11c = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + uVar8;
    }
    uVar11 = local_e0->funcFlags & 0xc0;
    if (uVar11 != 0) {
      pEVar24 = local_128->a[0].pExpr;
      uVar7 = pEVar24->op;
      if ((uVar7 == 0xa4) || (uVar7 == 0xa2)) {
        pEVar24->op2 = (u8)uVar11;
      }
    }
    sqlite3ExprCodeExprList(pParse,local_128,local_11c,0,'\x03');
  }
  if ((int)uVar8 < 2) {
    uVar29 = 8;
    zP4 = local_e0;
    if (uVar8 != 1) goto LAB_0016ba5b;
  }
  else {
    uVar29 = (ulong)(byte)((byte)pExpr->flags >> 7) << 5 | 8;
  }
  zP4 = sqlite3VtabOverloadFunction
                  (local_e8,local_e0,uVar8,*(Expr **)((long)local_128->a + (uVar29 - 8)));
LAB_0016ba5b:
  if ((zP4->funcFlags & 0x20) == 0) {
    pVVar19 = local_100;
    iVar9 = (uint)local_f8;
  }
  else {
    iVar9 = local_11c;
    if (zP4_00 == (CollSeq *)0x0) {
LAB_0016ba8d:
      zP4_00 = local_e8->pDfltColl;
      local_11c = iVar9;
    }
    pVVar19 = local_100;
    iVar9 = sqlite3VdbeAddOp3(local_100,0x52,0,0,0);
    sqlite3VdbeChangeP4(pVVar19,iVar9,(char *)zP4_00,-2);
    iVar9 = (uint)local_f8;
  }
LAB_0016bac8:
  iVar10 = sqlite3VdbeAddOp3(pVVar19,(pParse->iSelfTab == 0) + 0x3e,iVar9,local_11c,target);
  sqlite3VdbeChangeP4(pVVar19,iVar10,&zP4->nArg,-8);
  if (0 < (long)pVVar19->nOp) {
    pVVar19->aOp[(long)pVVar19->nOp + -1].p5 = (ushort)uVar8 & 0xff;
  }
  if (uVar8 == 0) {
    return target;
  }
  if (iVar9 != 0) {
    return target;
  }
  if (uVar8 == 1) {
    if (local_11c == 0) {
      return target;
    }
    bVar27 = pParse->nTempReg;
    if (7 < (ulong)bVar27) {
      return target;
    }
    pParse->nTempReg = bVar27 + 1;
    piVar23 = pParse->aTempReg + bVar27;
  }
  else {
    if ((int)uVar8 <= pParse->nRangeReg) {
      return target;
    }
    pParse->nRangeReg = uVar8;
    piVar23 = &pParse->iRangeReg;
  }
  *piVar23 = local_11c;
  return target;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2;               /* Various register numbers */
  Expr tempX;               /* Temporary expression node */
  int p5 = 0;

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

expr_code_doover:
  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        return pCol->iMem;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        return target;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      int iTab = pExpr->iTable;
      if( ExprHasProperty(pExpr, EP_FixedCol) ){
        /* This COLUMN expression is really a constant due to WHERE clause
        ** constraints, and that constant is coded by the pExpr->pLeft
        ** expresssion.  However, make sure the constant has the correct
        ** datatype by applying the Affinity of the table column to the
        ** constant.
        */
        int iReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft,target);
        int aff = sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
        if( aff!=SQLITE_AFF_BLOB ){
          static const char zAff[] = "B\000C\000D\000E";
          assert( SQLITE_AFF_BLOB=='A' );
          assert( SQLITE_AFF_TEXT=='B' );
          if( iReg!=target ){
            sqlite3VdbeAddOp2(v, OP_SCopy, iReg, target);
            iReg = target;
          }
          sqlite3VdbeAddOp4(v, OP_Affinity, iReg, 1, 0,
                            &zAff[(aff-'B')*2], P4_STATIC);
        }
        return iReg;
      }
      if( iTab<0 ){
        if( pParse->iSelfTab<0 ){
          /* Generating CHECK constraints or inserting into partial index */
          return pExpr->iColumn - pParse->iSelfTab;
        }else{
          /* Coding an expression that is part of an index where column names
          ** in the index refer to the table to which the index belongs */
          iTab = pParse->iSelfTab - 1;
        }
      }
      return sqlite3ExprCodeGetColumn(pParse, pExpr->y.pTab,
                               pExpr->iColumn, iTab, target,
                               pExpr->op2);
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      return target;
    }
    case TK_TRUEFALSE: {
      sqlite3VdbeAddOp2(v, OP_Integer, sqlite3ExprTruthValue(pExpr), target);
      return target;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      return target;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeLoadString(v, target, pExpr->u.zToken);
      return target;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      return target;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      return target;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        const char *z = sqlite3VListNumToName(pParse->pVList, pExpr->iColumn);
        assert( pExpr->u.zToken[0]=='?' || strcmp(pExpr->u.zToken, z)==0 );
        pParse->pVList[0] = 0; /* Indicate VList may no longer be enlarged */
        sqlite3VdbeAppendP4(v, (char*)z, P4_STATIC);
      }
      return target;
    }
    case TK_REGISTER: {
      return pExpr->iTable;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp2(v, OP_Cast, target,
                        sqlite3AffinityType(pExpr->u.zToken, 0));
      return inReg;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_IS:
    case TK_ISNOT:
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      p5 = SQLITE_NULLEQ;
      /* fall-through */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      Expr *pLeft = pExpr->pLeft;
      if( sqlite3ExprIsVector(pLeft) ){
        codeVectorCompare(pParse, pExpr, target, op, p5);
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
        codeCompare(pParse, pLeft, pExpr->pRight, op,
            r1, r2, inReg, SQLITE_STOREP2 | p5);
        assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
        assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
        assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
        assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
        assert(TK_EQ==OP_Eq); testcase(op==OP_Eq); VdbeCoverageIf(v,op==OP_Eq);
        assert(TK_NE==OP_Ne); testcase(op==OP_Ne); VdbeCoverageIf(v,op==OP_Ne);
        testcase( regFree1==0 );
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );            testcase( op==TK_AND );
      assert( TK_OR==OP_Or );              testcase( op==TK_OR );
      assert( TK_PLUS==OP_Add );           testcase( op==TK_PLUS );
      assert( TK_MINUS==OP_Subtract );     testcase( op==TK_MINUS );
      assert( TK_REM==OP_Remainder );      testcase( op==TK_REM );
      assert( TK_BITAND==OP_BitAnd );      testcase( op==TK_BITAND );
      assert( TK_BITOR==OP_BitOr );        testcase( op==TK_BITOR );
      assert( TK_SLASH==OP_Divide );       testcase( op==TK_SLASH );
      assert( TK_LSHIFT==OP_ShiftLeft );   testcase( op==TK_LSHIFT );
      assert( TK_RSHIFT==OP_ShiftRight );  testcase( op==TK_RSHIFT );
      assert( TK_CONCAT==OP_Concat );      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
        return target;
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
        return target;
#endif
      }else{
        tempX.op = TK_INTEGER;
        tempX.flags = EP_IntValue|EP_TokenOnly;
        tempX.u.iValue = 0;
        r1 = sqlite3ExprCodeTemp(pParse, &tempX, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );   testcase( op==TK_BITNOT );
      assert( TK_NOT==OP_Not );         testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_TRUTH: {
      int isTrue;    /* IS TRUE or IS NOT TRUE */
      int bNormal;   /* IS TRUE or IS FALSE */
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      bNormal = pExpr->op2==TK_IS;
      testcase( isTrue && bNormal);
      testcase( !isTrue && bNormal);
      sqlite3VdbeAddOp4Int(v, OP_IsTrue, r1, inReg, !isTrue, isTrue ^ bNormal);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, target);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        return pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      const char *zId;       /* The function name */
      u32 constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      sqlite3 *db = pParse->db;  /* The database connection */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        return pExpr->y.pWin->regResult;
      }
#endif

      if( ConstFactorOk(pParse) && sqlite3ExprIsConstantNotJoin(pExpr) ){
        /* SQL functions can be expensive. So try to move constant functions
        ** out of the inner loop, even if that means an extra OP_Copy. */
        return sqlite3ExprCodeAtInit(pParse, pExpr, -1);
      }
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      if( ExprHasProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      pDef = sqlite3FindFunction(db, zId, nFarg, enc, 0);
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
      if( pDef==0 && pParse->explain ){
        pDef = sqlite3FindFunction(db, "unknown", nFarg, enc, 0);
      }
#endif
      if( pDef==0 || pDef->xFinalize!=0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %s()", zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(pParse);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          VdbeCoverage(v);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }

      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
        assert( nFarg>=1 );
        return sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      }

#ifdef SQLITE_DEBUG
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      if( pDef->funcFlags & SQLITE_FUNC_AFFINITY ){
        const char *azAff[] = { "blob", "text", "numeric", "integer", "real" };
        char aff;
        assert( nFarg==1 );
        aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
        sqlite3VdbeLoadString(v, target, 
                              aff ? azAff[aff-SQLITE_AFF_BLOB] : "none");
        return target;
      }
#endif

      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          testcase( i==31 );
          constMask |= MASKBIT32(i);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pFarg ){
        if( constMask ){
          r1 = pParse->nMem+1;
          pParse->nMem += nFarg;
        }else{
          r1 = sqlite3GetTempRange(pParse, nFarg);
        }

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->funcFlags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->funcFlags & OPFLAG_LENGTHARG );
            pFarg->a[0].pExpr->op2 = 
                  pDef->funcFlags & (OPFLAG_LENGTHARG|OPFLAG_TYPEOFARG);
          }
        }

        sqlite3ExprCodeExprList(pParse, pFarg, r1, 0,
                                SQLITE_ECEL_DUP|SQLITE_ECEL_FACTOR);
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && ExprHasProperty(pExpr, EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      if( pDef->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
      if( pDef->funcFlags & SQLITE_FUNC_OFFSET ){
        Expr *pArg = pFarg->a[0].pExpr;
        if( pArg->op==TK_COLUMN ){
          sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
        }else{
          sqlite3VdbeAddOp2(v, OP_Null, 0, target);
        }
      }else
#endif
      {
        sqlite3VdbeAddOp4(v, pParse->iSelfTab ? OP_PureFunc0 : OP_Function0,
                          constMask, r1, target, (char*)pDef, P4_FUNCDEF);
        sqlite3VdbeChangeP5(v, (u8)nFarg);
      }
      if( nFarg && constMask==0 ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      return target;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      int nCol;
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      if( op==TK_SELECT && (nCol = pExpr->x.pSelect->pEList->nExpr)!=1 ){
        sqlite3SubselectError(pParse, nCol, 1);
      }else{
        return sqlite3CodeSubselect(pParse, pExpr);
      }
      break;
    }
    case TK_SELECT_COLUMN: {
      int n;
      if( pExpr->pLeft->iTable==0 ){
        pExpr->pLeft->iTable = sqlite3CodeSubselect(pParse, pExpr->pLeft);
      }
      assert( pExpr->iTable==0 || pExpr->pLeft->op==TK_SELECT );
      if( pExpr->iTable
       && pExpr->iTable!=(n = sqlite3ExprVectorSize(pExpr->pLeft)) 
      ){
        sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                                pExpr->iTable, n);
      }
      return pExpr->pLeft->iTable + pExpr->iColumn;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      return target;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      exprCodeBetween(pParse, pExpr, target, 0, 0);
      return target;
    }
    case TK_SPAN:
    case TK_COLLATE: 
    case TK_UPLUS: {
      pExpr = pExpr->pLeft;
      goto expr_code_doover; /* 2018-04-28: Prevent deep recursion. OSSFuzz. */
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->y.pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "r[%d]=%s.%s", target,
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->y.pTab->aCol[pExpr->iColumn].zName)
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.
      **
      ** EVIDENCE-OF: R-60985-57662 SQLite will convert the value back to
      ** floating point when extracting it from the record.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }

    case TK_VECTOR: {
      sqlite3ErrorMsg(pParse, "row value misused");
      break;
    }

    case TK_IF_NULL_ROW: {
      int addrINR;
      addrINR = sqlite3VdbeAddOp1(v, OP_IfNullRow, pExpr->iTable);
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      sqlite3VdbeJumpHere(v, addrINR);
      sqlite3VdbeChangeP3(v, addrINR, inReg);
      break;
    }

    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in the last element of pExpr->x.pList if pExpr->x.pList->nExpr is
    ** odd.  The Y is also optional.  If the number of elements in x.pList
    ** is even, then Y is omitted and the "otherwise" result is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(pParse);
      if( (pX = pExpr->pLeft)!=0 ){
        exprNodeCopy(&tempX, pX);
        testcase( pX->op==TK_COLUMN );
        exprToRegister(&tempX, exprCodeVector(pParse, &tempX, &regFree1));
        testcase( regFree1==0 );
        memset(&opCompare, 0, sizeof(opCompare));
        opCompare.op = TK_EQ;
        opCompare.pLeft = &tempX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr-1; i=i+2){
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(pParse);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeGoto(v, endLabel);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( (nExpr&1)!=0 ){
        sqlite3ExprCode(pParse, pEList->a[nExpr-1].pExpr, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
        VdbeCoverage(v);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}